

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

void ObsGetHandCardKnowledge
               (pyhanabi_observation_t *observation,int pid,int index,
               pyhanabi_card_knowledge_t *knowledge)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2c2,
                  "void ObsGetHandCardKnowledge(pyhanabi_observation_t *, int, int, pyhanabi_card_knowledge_t *)"
                 );
  }
  pvVar1 = observation->observation;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("observation->observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2c3,
                  "void ObsGetHandCardKnowledge(pyhanabi_observation_t *, int, int, pyhanabi_card_knowledge_t *)"
                 );
  }
  if (knowledge == (pyhanabi_card_knowledge_t *)0x0) {
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2c4,
                  "void ObsGetHandCardKnowledge(pyhanabi_observation_t *, int, int, pyhanabi_card_knowledge_t *)"
                 );
  }
  uVar5 = (ulong)pid;
  lVar2 = *(long *)((long)pvVar1 + 8);
  uVar4 = (*(long *)((long)pvVar1 + 0x10) - lVar2 >> 4) * -0x5555555555555555;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    lVar6 = uVar5 * 0x30;
    uVar5 = (ulong)index;
    lVar3 = *(long *)(lVar2 + 0x18 + lVar6);
    uVar4 = (*(long *)(lVar2 + 0x20 + lVar6) - lVar3 >> 5) * -0x5555555555555555;
    if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
      knowledge->knowledge = (void *)(lVar3 + uVar5 * 0x60);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar4
            );
}

Assistant:

void ObsGetHandCardKnowledge(pyhanabi_observation_t* observation, int pid,
                             int index, pyhanabi_card_knowledge_t* knowledge) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(knowledge != nullptr);
  knowledge->knowledge =
      &(reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
            observation->observation)
            ->Hands()
            .at(pid)
            .Knowledge()
            .at(index));
}